

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeModuleScopeLiveInstructions(AggressiveDCEPass *this)

{
  Module *pMVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  CommonDebugInfoInstructions CVar4;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar5;
  DefUseManager *pDVar6;
  Instruction *pIVar7;
  DebugInfoManager *this_00;
  Instruction *pIVar8;
  IRContext *this_01;
  uint32_t i;
  bool bVar9;
  Instruction *exec;
  Instruction **ppIVar10;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar10 = (Instruction **)
             ((long)&(pMVar1->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  while (pIVar8 = *ppIVar10,
        pIVar8 != (Instruction *)
                  ((long)&(pMVar1->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>
                  + 8U)) {
    AddToWorklist(this,pIVar8);
    ppIVar10 = &(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar10 = (Instruction **)
             ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  while (pIVar8 = *ppIVar10,
        pIVar8 != (Instruction *)
                  ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    if (this->preserve_interface_ == false) {
      uVar2 = Instruction::unique_id(pIVar8);
      utils::BitVector::Set(&this->live_insts_,uVar2);
      pDVar6 = Pass::get_def_use_mgr((Pass *)this);
      uVar2 = Instruction::GetSingleWordInOperand(pIVar8,1);
      pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar2);
      AddToWorklist(this,pIVar7);
      uVar2 = 3;
      while( true ) {
        uVar3 = Instruction::NumInOperands(pIVar8);
        if (uVar3 <= uVar2) break;
        pDVar6 = Pass::get_def_use_mgr((Pass *)this);
        uVar3 = Instruction::GetSingleWordInOperand(pIVar8,uVar2);
        pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar3);
        uVar3 = Instruction::GetSingleWordInOperand(pIVar7,0);
        if ((uVar3 == 3) && (this->remove_outputs_ == false)) {
          AddToWorklist(this,pIVar7);
        }
        uVar2 = uVar2 + 1;
      }
    }
    else {
      AddToWorklist(this,pIVar8);
    }
    ppIVar10 = &(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar10 = (Instruction **)
             ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    pIVar8 = *ppIVar10;
    if (pIVar8 == (Instruction *)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
      pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      bVar9 = false;
      ppIVar10 = (Instruction **)
                 ((long)&(pMVar1->ext_inst_debuginfo_).
                         super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      while (pIVar8 = *ppIVar10,
            pIVar8 != (Instruction *)
                      ((long)&(pMVar1->ext_inst_debuginfo_).
                              super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
        CVar4 = Instruction::GetCommonDebugOpcode(pIVar8);
        if (CVar4 == CommonDebugInfoDebugGlobalVariable) {
          local_50._8_8_ = 0;
          local_38 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:663:21)>
                     ::_M_invoke;
          local_40 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:663:21)>
                     ::_M_manager;
          local_50._M_unused._M_object = this;
          Instruction::ForEachInId(pIVar8,(function<void_(unsigned_int_*)> *)&local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
          bVar9 = true;
        }
        ppIVar10 = &(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
      this_01 = (this->super_MemPass).super_Pass.context_;
      if (bVar9) {
        this_00 = IRContext::get_debug_info_mgr(this_01);
        pIVar8 = analysis::DebugInfoManager::GetDebugInfoNone(this_00);
        AddToWorklist(this,pIVar8);
        this_01 = (this->super_MemPass).super_Pass.context_;
      }
      pMVar1 = (this_01->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      ppIVar10 = (Instruction **)
                 ((long)&(pMVar1->ext_inst_debuginfo_).
                         super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      while (pIVar8 = *ppIVar10,
            pIVar8 != (Instruction *)
                      ((long)&(pMVar1->ext_inst_debuginfo_).
                              super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
        NVar5 = Instruction::GetShader100DebugOpcode(pIVar8);
        if ((((NVar5 == NonSemanticShaderDebugInfo100DebugCompilationUnit) ||
             (NVar5 == NonSemanticShaderDebugInfo100DebugSource)) ||
            (NVar5 == NonSemanticShaderDebugInfo100DebugEntryPoint)) ||
           (NVar5 == NonSemanticShaderDebugInfo100DebugSourceContinued)) {
          AddToWorklist(this,pIVar8);
        }
        ppIVar10 = &(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
      return;
    }
    if (pIVar8->opcode_ == OpDecorate) {
      uVar2 = Instruction::GetSingleWordInOperand(pIVar8,1);
      if (uVar2 == 0xb) {
        uVar2 = Instruction::GetSingleWordInOperand(pIVar8,2);
        if (uVar2 == 0x19) {
          AddToWorklist(this,pIVar8);
        }
      }
      if (((this->super_MemPass).super_Pass.context_)->preserve_bindings_ == true) {
        uVar2 = Instruction::GetSingleWordInOperand(pIVar8,1);
        if (uVar2 != 0x22) {
          uVar2 = Instruction::GetSingleWordInOperand(pIVar8,1);
          if (uVar2 != 0x21) goto LAB_004ad4f3;
        }
        AddToWorklist(this,pIVar8);
      }
LAB_004ad4f3:
      if (((this->super_MemPass).super_Pass.context_)->preserve_spec_constants_ == true) {
        uVar2 = Instruction::GetSingleWordInOperand(pIVar8,1);
        if (uVar2 == 1) {
          AddToWorklist(this,pIVar8);
        }
      }
    }
    ppIVar10 = &(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

void AggressiveDCEPass::InitializeModuleScopeLiveInstructions() {
  // Keep all execution modes.
  for (auto& exec : get_module()->execution_modes()) {
    AddToWorklist(&exec);
  }
  // Keep all entry points.
  for (auto& entry : get_module()->entry_points()) {
    if (!preserve_interface_) {
      live_insts_.Set(entry.unique_id());
      // The actual function is live always.
      AddToWorklist(
          get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(1u)));
      for (uint32_t i = 3; i < entry.NumInOperands(); ++i) {
        auto* var = get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
        auto storage_class = var->GetSingleWordInOperand(0u);
        // Vulkan support outputs without an associated input, but not inputs
        // without an associated output. Don't remove outputs unless explicitly
        // allowed.
        if (!remove_outputs_ &&
            spv::StorageClass(storage_class) == spv::StorageClass::Output) {
          AddToWorklist(var);
        }
      }
    } else {
      AddToWorklist(&entry);
    }
  }
  for (auto& anno : get_module()->annotations()) {
    if (anno.opcode() == spv::Op::OpDecorate) {
      // Keep workgroup size.
      if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
              spv::Decoration::BuiltIn &&
          spv::BuiltIn(anno.GetSingleWordInOperand(2u)) ==
              spv::BuiltIn::WorkgroupSize) {
        AddToWorklist(&anno);
      }

      if (context()->preserve_bindings()) {
        // Keep all bindings.
        if ((spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::DescriptorSet) ||
            (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::Binding)) {
          AddToWorklist(&anno);
        }
      }

      if (context()->preserve_spec_constants()) {
        // Keep all specialization constant instructions
        if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
            spv::Decoration::SpecId) {
          AddToWorklist(&anno);
        }
      }
    }
  }

  // For each DebugInfo GlobalVariable keep all operands except the Variable.
  // Later, if the variable is killed with KillInst(), we will set the operand
  // to DebugInfoNone. Create and save DebugInfoNone now for this possible
  // later use. This is slightly unoptimal, but it avoids generating it during
  // instruction killing when the module is not consistent.
  bool debug_global_seen = false;
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (dbg.GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
      continue;
    debug_global_seen = true;
    dbg.ForEachInId([this](const uint32_t* iid) {
      Instruction* in_inst = get_def_use_mgr()->GetDef(*iid);
      if (in_inst->opcode() == spv::Op::OpVariable) return;
      AddToWorklist(in_inst);
    });
  }
  if (debug_global_seen) {
    auto dbg_none = context()->get_debug_info_mgr()->GetDebugInfoNone();
    AddToWorklist(dbg_none);
  }

  // Add top level DebugInfo to worklist
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    auto op = dbg.GetShader100DebugOpcode();
    if (op == NonSemanticShaderDebugInfo100DebugCompilationUnit ||
        op == NonSemanticShaderDebugInfo100DebugEntryPoint ||
        op == NonSemanticShaderDebugInfo100DebugSource ||
        op == NonSemanticShaderDebugInfo100DebugSourceContinued) {
      AddToWorklist(&dbg);
    }
  }
}